

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreationTest.cpp
# Opt level: O3

void __thiscall
TApp_IncorrectConstructionTakeLastExpected_Test::TestBody
          (TApp_IncorrectConstructionTakeLastExpected_Test *this)

{
  bool bVar1;
  Option *this_00;
  vector<int,_std::allocator<int>_> vec;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  AssertHelper local_80;
  vector<int,_std::allocator<int>_> local_78;
  string local_58;
  string local_38;
  
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"--vec","");
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
  this_00 = CLI::App::add_option<int>(&(this->super_TApp).app,&local_38,&local_78,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  CLI::Option::expected(this_00,1);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      CLI::Option::multi_option_policy(this_00,TakeLast);
    }
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      CLI::Option::expected(this_00,2);
    }
    testing::Message::Message((Message *)&local_88);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0xa3,
               "Expected: cat->expected(2) throws an exception of type CLI::IncorrectConstruction.\n  Actual: it throws nothing."
              );
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_88.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0011279e;
    bVar1 = testing::internal::IsTrue(true);
  }
  else {
    testing::Message::Message((Message *)&local_88);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0xa2,
               "Expected: cat->multi_option_policy(CLI::MultiOptionPolicy::TakeLast) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_88.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0011279e;
    bVar1 = testing::internal::IsTrue(true);
  }
  if ((bVar1 != false) &&
     (local_88.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(long *)local_88.ptr_ + 8))();
  }
LAB_0011279e:
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST_F(TApp, IncorrectConstructionTakeLastExpected) {
    std::vector<int> vec;
    auto cat = app.add_option("--vec", vec);
    cat->expected(1);
    ASSERT_NO_THROW(cat->multi_option_policy(CLI::MultiOptionPolicy::TakeLast));
    EXPECT_THROW(cat->expected(2), CLI::IncorrectConstruction);
}